

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_pdfa.c
# Opt level: O0

void HPDF_PDFA_ClearXmpExtensions(HPDF_Doc pdf)

{
  HPDF_List list_00;
  HPDF_MMgr mmgr;
  void *aptr;
  HPDF_List list;
  HPDF_UINT i;
  HPDF_Doc pdf_local;
  
  list_00 = pdf->xmp_extensions;
  for (list._4_4_ = 0; list._4_4_ < list_00->count; list._4_4_ = list._4_4_ + 1) {
    mmgr = pdf->mmgr;
    aptr = HPDF_List_ItemAt(list_00,list._4_4_);
    HPDF_FreeMem(mmgr,aptr);
  }
  HPDF_List_Clear(pdf->xmp_extensions);
  return;
}

Assistant:

void
HPDF_PDFA_ClearXmpExtensions(HPDF_Doc pdf)
{
    HPDF_UINT i;
    HPDF_List list;

    list = pdf->xmp_extensions;
    for (i = 0; i < list->count; i++) {
        HPDF_FreeMem(pdf->mmgr, HPDF_List_ItemAt(list, i));
    }
    HPDF_List_Clear(pdf->xmp_extensions);
}